

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_18535::TypeNode::TypeNode
          (TypeNode *this,xmlNodePtr node,string *name_,string *file_,NodeLoader loader_)

{
  pointer pcVar1;
  
  this->xml = node;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name_->_M_string_length);
  (this->file)._M_dataplus._M_p = (pointer)&(this->file).field_2;
  pcVar1 = (file_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->file,pcVar1,pcVar1 + file_->_M_string_length);
  this->loader = loader_;
  return;
}

Assistant:

TypeNode
            ( xmlNodePtr node = 0
            , string const& name_ = string()
            , string const& file_ = string()
            , NodeLoader loader_ = 0 )
            : xml(node), name(name_), file(file_), loader(loader_) {}